

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseInputFiles
          (CommandLineInterface *this,DescriptorPool *descriptor_pool,DiskSourceTree *source_tree,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  pointer pbVar1;
  pointer pcVar2;
  lts_20250127 *this_00;
  bool bVar3;
  FileDescriptor *pFVar4;
  ostream *poVar5;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  pointer pbVar6;
  size_type in_R9;
  bool bVar7;
  string_view s;
  FixedMapping replacements;
  string_view file_name;
  string_view name;
  FileDescriptor *parsed_file;
  pointer local_a8;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_a0;
  DescriptorPool *local_98;
  pointer local_90;
  ostream *local_88;
  key_arg<std::basic_string_view<char>_> local_80;
  size_type local_70;
  pointer local_68;
  iterator local_60;
  iterator local_40;
  
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar1 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (this->input_files_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      file_name._M_str = (pbVar6->_M_dataplus)._M_p;
      file_name._M_len = pbVar6->_M_string_length;
      DescriptorPool::AddDirectInputFile(descriptor_pool,file_name,false);
    }
  }
  pbVar6 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = parsed_files;
  local_98 = descriptor_pool;
  do {
    if (pbVar6 == local_a8) {
LAB_0019afda:
      bVar7 = pbVar6 == local_a8;
      DescriptorPool::ClearDirectInputFiles(descriptor_pool);
      return bVar7;
    }
    name._M_str = (pbVar6->_M_dataplus)._M_p;
    name._M_len = pbVar6->_M_string_length;
    parsed_file = DescriptorPool::FindFileByName(descriptor_pool,name);
    if (parsed_file == (FileDescriptor *)0x0) goto LAB_0019afda;
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::push_back(parsed_files,&parsed_file);
    if ((this->disallow_services_ == true) && (0 < parsed_file->service_count_)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(parsed_file->name_->_M_dataplus)._M_p,
                          parsed_file->name_->_M_string_length);
      poVar5 = std::operator<<(poVar5,
                               ": This file contains services, but --disallow_services was used.");
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_0019afda;
    }
    if (this->direct_dependencies_explicitly_set_ == true) {
      index = 0;
      bVar7 = false;
      local_90 = pbVar6;
      while( true ) {
        if (parsed_file->dependency_count_ <= index) break;
        pFVar4 = FileDescriptor::dependency(parsed_file,index);
        local_80._M_str = (pFVar4->name_->_M_dataplus)._M_p;
        local_80._M_len = pFVar4->name_->_M_string_length;
        local_60 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                               *)&this->direct_dependencies_,&local_80);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::AssertNotDebugCapacity
                  (&(this->direct_dependencies_).
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
        local_40.ctrl_ = (ctrl_t *)0x0;
        bVar3 = absl::lts_20250127::container_internal::operator==(&local_60,&local_40);
        if (bVar3) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(parsed_file->name_->_M_dataplus)._M_p,
                              parsed_file->name_->_M_string_length);
          local_88 = std::operator<<(poVar5,": ");
          pcVar2 = (this->direct_dependencies_violation_msg_)._M_dataplus._M_p;
          this_00 = (lts_20250127 *)(this->direct_dependencies_violation_msg_)._M_string_length;
          pFVar4 = FileDescriptor::dependency(parsed_file,index);
          local_68 = (pFVar4->name_->_M_dataplus)._M_p;
          local_70 = pFVar4->name_->_M_string_length;
          local_80._M_len = 2;
          local_80._M_str = "%s";
          s._M_str = (char *)&local_80;
          s._M_len = (size_t)pcVar2;
          replacements._M_len = in_R9;
          replacements._M_array = (iterator)0x1;
          absl::lts_20250127::StrReplaceAll_abi_cxx11_((string *)&local_60,this_00,s,replacements);
          poVar5 = std::operator<<(local_88,(string *)&local_60);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_60);
          bVar7 = true;
        }
        index = index + 1;
      }
      pbVar6 = local_90;
      parsed_files = local_a0;
      descriptor_pool = local_98;
      if (bVar7) goto LAB_0019afda;
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

bool CommandLineInterface::ParseInputFiles(
    DescriptorPool* descriptor_pool, DiskSourceTree* source_tree,
    std::vector<const FileDescriptor*>* parsed_files) {

  if (!proto_path_.empty()) {
    // Track unused imports in all source files that were loaded from the
    // filesystem. We do not track unused imports for files loaded from
    // descriptor sets as they may be programmatically generated in which case
    // exerting this level of rigor is less desirable. We're also making the
    // assumption that the initial parse of the proto from the filesystem
    // was rigorous in checking unused imports and that the descriptor set
    // being parsed was produced then and that it was subsequent mutations
    // of that descriptor set that left unused imports.
    //
    // Note that relying on proto_path exclusively is limited in that we may
    // be loading descriptors from both the filesystem and descriptor sets
    // depending on the invocation. At least for invocations that are
    // exclusively reading from descriptor sets, we can eliminate this failure
    // condition.
    for (const auto& input_file : input_files_) {
      descriptor_pool->AddDirectInputFile(input_file);
    }
  }

  bool result = true;
  // Parse each file.
  for (const auto& input_file : input_files_) {
    // Import the file.
    const FileDescriptor* parsed_file =
        descriptor_pool->FindFileByName(input_file);
    if (parsed_file == nullptr) {
      result = false;
      break;
    }
    parsed_files->push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      std::cerr << parsed_file->name()
                << ": This file contains services, but "
                   "--disallow_services was used."
                << std::endl;
      result = false;
      break;
    }

    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); ++i) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << absl::StrReplaceAll(
                           direct_dependencies_violation_msg_,
                           {{"%s", parsed_file->dependency(i)->name()}})
                    << std::endl;
        }
      }
      if (indirect_imports) {
        result = false;
        break;
      }
    }
  }
  descriptor_pool->ClearDirectInputFiles();
  return result;
}